

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyboardConfigTab.cpp
# Opt level: O2

QVariant * __thiscall
ShortcutTableModel::headerData
          (QVariant *__return_storage_ptr__,ShortcutTableModel *this,int section,
          Orientation orientation,int role)

{
  QArrayDataPointer<char16_t> QStack_28;
  
  if (orientation == Horizontal && role == 0) {
    if (section == 1) {
      tr((QString *)&QStack_28,"Key sequence",(char *)0x0,-1);
      QVariant::QVariant(__return_storage_ptr__,(QString *)&QStack_28);
    }
    else {
      if (section != 0) goto LAB_00145a7f;
      tr((QString *)&QStack_28,"Action",(char *)0x0,-1);
      QVariant::QVariant(__return_storage_ptr__,(QString *)&QStack_28);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_28);
  }
  else {
LAB_00145a7f:
    (__return_storage_ptr__->d).data.shared = (PrivateShared *)0x0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 8) = 0;
    *(undefined8 *)((long)&(__return_storage_ptr__->d).data + 0x10) = 0;
    *(undefined8 *)&(__return_storage_ptr__->d).field_0x18 = 2;
  }
  return __return_storage_ptr__;
}

Assistant:

virtual QVariant headerData(int section, Qt::Orientation orientation, int role = Qt::DisplayRole) const override {
        if (orientation == Qt::Horizontal && role == Qt::DisplayRole) {
            switch (section) {
                case 0:
                    return tr("Action");
                case 1:
                    return tr("Key sequence");
                default:
                    break;
            }
        }

        return {};
    }